

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

int __thiscall Bstrlib::String::caselessFind(String *this,char *b,int pos)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  tagbstring t;
  tagbstring local_28;
  
  iVar2 = -1;
  iVar3 = iVar2;
  if (b != (char *)0x0) {
    uVar1 = (this->super_tagbstring).slen;
    if ((((uint)pos <= uVar1) && (iVar3 = pos, *b != '\0')) && (iVar3 = iVar2, uVar1 != pos)) {
      local_28.data = (uchar *)b;
      sVar4 = strlen(b);
      local_28.slen = (int)sVar4;
      local_28.mlen = -1;
      iVar3 = binstrcaseless(&this->super_tagbstring,pos,&local_28);
    }
  }
  return iVar3;
}

Assistant:

int String::caselessFind(const char * b, int pos) const
    {
        struct tagbstring t;

        if (NULL == b) return BSTR_ERR;

        if ((unsigned int) pos > (unsigned int) slen)    return BSTR_ERR;
        if ('\0' == b[0])            return pos;
        if (pos == slen)            return BSTR_ERR;

        btfromcstr(t, b);
        return binstrcaseless((bstring) this, pos, (bstring) &t);
    }